

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_casts.cpp
# Opt level: O3

bool duckdb::EnumEnumCast<unsigned_int,unsigned_short>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  undefined1 uVar1;
  Vector *pVVar2;
  LogicalType res_enum_type;
  string_t *dictionary_data;
  VectorTryCastData vector_cast_data;
  LogicalType LStack_88;
  data_ptr_t local_70;
  Vector *local_68;
  CastParameters *local_60;
  undefined1 local_58;
  undefined1 *local_50;
  data_ptr_t *local_48;
  CastParameters *local_40;
  Vector **local_38;
  
  pVVar2 = EnumType::GetValuesInsertOrder(&source->type);
  local_70 = pVVar2->data;
  LogicalType::LogicalType(&LStack_88,&result->type);
  local_38 = &local_68;
  local_58 = 1;
  local_68 = result;
  local_60 = parameters;
  local_50 = &LStack_88.id_;
  local_48 = &local_70;
  local_40 = parameters;
  UnaryExecutor::
  ExecuteStandard<unsigned_int,unsigned_short,duckdb::UnaryLambdaWrapperWithNulls,duckdb::EnumEnumCast<unsigned_int,unsigned_short>(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::_lambda(unsigned_int,duckdb::ValidityMask&,unsigned_long)_1_>
            (source,result,count,&local_50,true,CAN_THROW_RUNTIME_ERROR);
  uVar1 = local_58;
  LogicalType::~LogicalType(&LStack_88);
  return (bool)uVar1;
}

Assistant:

bool EnumEnumCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto &enum_dictionary = EnumType::GetValuesInsertOrder(source.GetType());
	auto dictionary_data = FlatVector::GetData<string_t>(enum_dictionary);
	auto res_enum_type = result.GetType();

	VectorTryCastData vector_cast_data(result, parameters);
	UnaryExecutor::ExecuteWithNulls<SRC_TYPE, RES_TYPE>(
	    source, result, count, [&](SRC_TYPE value, ValidityMask &mask, idx_t row_idx) {
		    auto key = EnumType::GetPos(res_enum_type, dictionary_data[value]);
		    if (key == -1) {
			    if (!parameters.error_message) {
				    return HandleVectorCastError::Operation<RES_TYPE>(CastExceptionText<SRC_TYPE, RES_TYPE>(value),
				                                                      mask, row_idx, vector_cast_data);
			    } else {
				    mask.SetInvalid(row_idx);
			    }
			    return RES_TYPE();
		    } else {
			    return UnsafeNumericCast<RES_TYPE>(key);
		    }
	    });
	return vector_cast_data.all_converted;
}